

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_tweak_add
              (secp256k1_context *ctx,secp256k1_pubkey *output_pubkey,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  undefined1 local_88 [8];
  secp256k1_ge pk;
  uchar *tweak32_local;
  secp256k1_xonly_pubkey *internal_pubkey_local;
  secp256k1_pubkey *output_pubkey_local;
  secp256k1_context *ctx_local;
  
  pk._80_8_ = tweak32;
  if (output_pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output_pubkey != NULL");
  }
  else {
    memset(output_pubkey,0,0x40);
    iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    }
    else if (internal_pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"internal_pubkey != NULL");
    }
    else if (pk._80_8_ == 0) {
      secp256k1_callback_call(&ctx->illegal_callback,"tweak32 != NULL");
    }
    else {
      iVar1 = secp256k1_xonly_pubkey_load(ctx,(secp256k1_ge *)local_88,internal_pubkey);
      if ((iVar1 != 0) &&
         (iVar1 = secp256k1_ec_pubkey_tweak_add_helper
                            (&ctx->ecmult_ctx,(secp256k1_ge *)local_88,(uchar *)pk._80_8_),
         iVar1 != 0)) {
        secp256k1_pubkey_save(output_pubkey,(secp256k1_ge *)local_88);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *output_pubkey, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output_pubkey != NULL);
    memset(output_pubkey, 0, sizeof(*output_pubkey));
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx, &pk, tweak32)) {
        return 0;
    }
    secp256k1_pubkey_save(output_pubkey, &pk);
    return 1;
}